

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

void __thiscall
testing::internal::PrettyUnitTestResultPrinter::OnTestCaseEnd
          (PrettyUnitTestResultPrinter *this,TestCase *test_case)

{
  pointer pcVar1;
  _Alloc_hider _Var2;
  pointer ppTVar3;
  testing *this_00;
  char *in_R8;
  string counts;
  TimeInMillis local_60;
  string local_58;
  string local_38;
  
  if (FLAGS_gtest_print_time == '\x01') {
    this_00 = (testing *)0x0;
    for (ppTVar3 = (test_case->test_info_list_).
                   super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        ppTVar3 !=
        (test_case->test_info_list_).
        super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>._M_impl.
        super__Vector_impl_data._M_finish; ppTVar3 = ppTVar3 + 1) {
      this_00 = (testing *)(ulong)((int)this_00 + (uint)(*ppTVar3)->should_run_);
    }
    FormatCountableNoun_abi_cxx11_(&local_58,this_00,0x142db5,"tests",in_R8);
    ColoredPrintf(COLOR_GREEN,"[----------] ");
    _Var2._M_p = local_58._M_dataplus._M_p;
    pcVar1 = (test_case->name_)._M_dataplus._M_p;
    local_60 = test_case->elapsed_time_;
    StreamableToString<long_long>(&local_38,&local_60);
    printf("%s from %s (%s ms total)\n\n",_Var2._M_p,pcVar1,local_38._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p);
    }
    fflush(_stdout);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

void PrettyUnitTestResultPrinter::OnTestCaseEnd(const TestCase& test_case) {
  if (!GTEST_FLAG(print_time)) return;

  const std::string counts =
      FormatCountableNoun(test_case.test_to_run_count(), "test", "tests");
  ColoredPrintf(COLOR_GREEN, "[----------] ");
  printf("%s from %s (%s ms total)\n\n", counts.c_str(), test_case.name(),
         internal::StreamableToString(test_case.elapsed_time()).c_str());
  fflush(stdout);
}